

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::resize_bilinear(Mat *src,Mat *dst,int w,int h)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  undefined1 auVar12 [16];
  Mat local_90;
  Mat local_60;
  
  if ((src->w == w) && (src->h == h)) {
    if (dst != src) {
      piVar2 = src->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      piVar2 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar2;
      dst->elemsize = src->elemsize;
      iVar5 = src->w;
      iVar3 = src->h;
      iVar4 = src->c;
      dst->dims = src->dims;
      dst->w = iVar5;
      dst->h = iVar3;
      dst->c = iVar4;
      dst->cstep = src->cstep;
    }
  }
  else if (src->dims == 3) {
    uVar1 = src->c;
    auVar12._0_4_ = -(uint)(dst->dims == 3);
    auVar12._4_4_ = -(uint)(w == dst->w);
    auVar12._8_4_ = -(uint)(h == dst->h);
    auVar12._12_4_ = -(uint)(uVar1 == dst->c);
    iVar5 = movmskps(3,auVar12);
    if ((iVar5 == 0xf) && (dst->elemsize == 4)) {
      if (dst->data == (void *)0x0) {
        return;
      }
      sVar10 = dst->cstep;
      uVar6 = uVar1;
    }
    else {
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      dst->elemsize = 4;
      dst->dims = 3;
      dst->w = w;
      dst->h = h;
      dst->c = uVar1;
      sVar10 = (long)(h * w) + 3U & 0x3ffffffffffffffc;
      dst->cstep = sVar10;
      lVar11 = (long)(int)uVar1 * sVar10;
      if (lVar11 == 0) {
        return;
      }
      pvVar7 = malloc(lVar11 * 4 + 0x1c);
      pvVar8 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar8 - 8) = pvVar7;
      dst->data = pvVar8;
      piVar2 = (int *)((long)pvVar8 + lVar11 * 4);
      dst->refcount = piVar2;
      *piVar2 = 1;
      uVar6 = dst->c;
    }
    if (0 < (int)uVar1 && (long)(int)uVar6 * sVar10 != 0) {
      uVar9 = 0;
      do {
        local_60.w = src->w;
        local_60.h = src->h;
        local_60.elemsize = src->elemsize;
        local_60.data = (void *)(src->cstep * uVar9 * local_60.elemsize + (long)src->data);
        local_60.refcount = (int *)0x0;
        local_60.dims = 2;
        local_60.c = 1;
        local_60.cstep = (size_t)(local_60.h * local_60.w);
        local_90.w = dst->w;
        local_90.h = dst->h;
        local_90.elemsize = dst->elemsize;
        local_90.data = (void *)(dst->cstep * uVar9 * local_90.elemsize + (long)dst->data);
        local_90.refcount = (int *)0x0;
        local_90.dims = 2;
        local_90.c = 1;
        local_90.cstep = (size_t)(local_90.h * local_90.w);
        resize_bilinear_image(&local_60,&local_90,w,h);
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
  }
  else if (src->dims == 2) {
    if ((((dst->dims == 2) && (dst->w == w)) && (dst->h == h)) && (dst->elemsize == 4)) {
      if (dst->data == (void *)0x0) {
        return;
      }
      sVar10 = dst->cstep;
    }
    else {
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      dst->elemsize = 4;
      dst->dims = 2;
      dst->w = w;
      dst->h = h;
      dst->c = 1;
      sVar10 = (size_t)(h * w);
      dst->cstep = sVar10;
      if (h * w == 0) {
        return;
      }
      pvVar7 = malloc(sVar10 * 4 + 0x1c);
      pvVar8 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar8 - 8) = pvVar7;
      dst->data = pvVar8;
      piVar2 = (int *)((long)pvVar8 + sVar10 * 4);
      dst->refcount = piVar2;
      *piVar2 = 1;
    }
    if ((long)dst->c * sVar10 != 0) {
      resize_bilinear_image(src,dst,w,h);
      return;
    }
  }
  return;
}

Assistant:

void resize_bilinear(const Mat& src, Mat& dst, int w, int h)
{
    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        resize_bilinear_image(src, dst, w, h);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat resizem = dst.channel(q);

            resize_bilinear_image(m, resizem, w, h);
        }
    }
}